

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_Prepare(Ifn_Ntk_t *p,word *pTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  Ifn_Obj_t *pIVar7;
  
  iVar3 = p->nInps;
  lVar4 = (long)iVar3;
  if (iVar3 < nVars) {
    __assert_fail("nVars <= p->nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x76,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
  }
  p->pTruth = pTruth;
  p->nVars = nVars;
  iVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar2 = 1;
  }
  p->nWords = iVar2;
  uVar5 = p->nObjs;
  lVar6 = (long)(int)uVar5;
  pIVar7 = p->Nodes + lVar4;
  for (; lVar4 < lVar6; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)pIVar7;
    if ((uVar1 & 7) == 6) {
      *(uint *)pIVar7 = uVar1 & 0xffff00fe | (uVar5 & 0xff) << 8;
      uVar5 = uVar5 + (1 << ((byte)uVar1 >> 3));
      p->nPars = uVar5;
    }
    pIVar7 = pIVar7 + 1;
  }
  p->nParsVIni = uVar5;
  iVar2 = Abc_Base2Log(nVars);
  p->nParsVNum = iVar2;
  iVar3 = iVar3 * iVar2 + uVar5;
  p->nPars = iVar3;
  if (iVar3 < 0x401) {
    memset(p->Values,0xff,(long)iVar3 << 2);
    return iVar3;
  }
  __assert_fail("p->nPars <= IFN_PAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x89,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
}

Assistant:

int Ifn_Prepare( Ifn_Ntk_t * p, word * pTruth, int nVars )
{
    int i, fVerbose = 0;
    assert( nVars <= p->nInps );
    p->pTruth = pTruth;
    p->nVars  = nVars;
    p->nWords = Abc_TtWordNum(nVars);
    p->nPars  = p->nObjs;
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        if ( p->Nodes[i].Type != IFN_DSD_PRIME )
            continue;
        p->Nodes[i].iFirst = p->nPars;
        p->nPars += (1 << p->Nodes[i].nFanins);
        if ( fVerbose )
            printf( "Node %d  Start %d  Vars %d\n", i, p->Nodes[i].iFirst, (1 << p->Nodes[i].nFanins) );
    }
    if ( fVerbose )
        printf( "Groups start %d\n", p->nPars );
    p->nParsVIni = p->nPars;
    p->nParsVNum = Abc_Base2Log(nVars);
    p->nPars    += p->nParsVNum * p->nInps;
    assert( p->nPars <= IFN_PAR );
    memset( p->Values, 0xFF, sizeof(int) * p->nPars );
    return p->nPars;
}